

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

PointSet * __thiscall
hnsw::HNSWIndex::SelectNeighborsHeuristic
          (PointSet *__return_storage_ptr__,HNSWIndex *this,float *q,PointSet *candidates,uint32_t M
          )

{
  pointer *pppVar1;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  __first;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  __last;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppfVar4;
  iterator __position;
  pointer ppVar5;
  PointSet *__range3;
  bool bVar6;
  float fVar7;
  Point p;
  MinHeap closest_points;
  PointGreaterComparator local_71;
  ulong local_70;
  undefined1 local_68 [8];
  pointer ppStack_60;
  pointer local_58;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  local_50;
  
  __first._M_current =
       (candidates->
       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (candidates->
       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_70 = (ulong)M;
  if (local_70 < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0.0;
    ppStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    std::
    priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
    ::
    priority_queue<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,float>*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>
              ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
                *)&local_50,__first,__last,&local_71,
               (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)local_68);
    if ((pair<unsigned_int,_float>)local_68 != (pair<unsigned_int,_float>)0x0) {
      operator_delete((void *)local_68);
    }
    fVar7 = 0.0;
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(__return_storage_ptr__,local_70);
    if (local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_68 = *(undefined1 (*) [8])
                    local_50.c.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        std::
        priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
        ::pop(&local_50);
        ppVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        ppVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (ppVar5 = ppVar2; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1) {
        }
        if (ppVar2 == ppVar3) {
LAB_00106488:
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
            ::_M_realloc_insert<std::pair<unsigned_int,float>const&>
                      ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                        *)__return_storage_ptr__,__position,(pair<unsigned_int,_float> *)local_68);
          }
          else {
            (__position._M_current)->first = local_68._0_4_;
            (__position._M_current)->second = (float)local_68._4_4_;
            pppVar1 = &(__return_storage_ptr__->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          if ((long)(__return_storage_ptr__->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3 == local_70) break;
        }
        else {
          bVar6 = true;
          do {
            ppVar5 = ppVar2 + 1;
            ppfVar4 = (this->points_).row_ptrs_.
                      super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (**this->distance_->_vptr_Distance)
                      (this->distance_,ppfVar4[(ulong)local_68 & 0xffffffff],ppfVar4[ppVar2->first])
            ;
            if (fVar7 < (float)local_68._4_4_) {
              bVar6 = false;
              break;
            }
            ppVar2 = ppVar5;
          } while (ppVar5 != ppVar3);
          if (bVar6) goto LAB_00106488;
        }
      } while (local_50.c.
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_50.c.
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_float> *)0x0) {
      operator_delete(local_50.c.
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    vector(__return_storage_ptr__,candidates);
  }
  return __return_storage_ptr__;
}

Assistant:

PointSet SelectNeighborsHeuristic(const float *q, PointSet &candidates, uint32_t M) {
    if (candidates.size() <= M) {
      return candidates;
    }

    MinHeap closest_points(candidates.begin(), candidates.end());

    PointSet selected_points;
    selected_points.reserve(M);
    while (!closest_points.empty()) {
      Point p = closest_points.top();
      closest_points.pop();

      bool is_nearest = true;

#ifdef PREFETCH_DATA
      // prefetch into cache
      for (const auto &neighbor : selected_points) {
        _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
      }
#endif

      for (const auto &neighbor : selected_points) {
        float dist = distance_(points_[p.first], points_[neighbor.first]);
        if (dist < p.second) {
          is_nearest = false;
          break;
        }
      }
      if (is_nearest) {
        selected_points.push_back(p);
        if (selected_points.size() == M) {
          break;
        }
      }
    }

    return selected_points;
  }